

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicFixedWingAircraft.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::GED_BasicFixedWingAircraft::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GED_BasicFixedWingAircraft *this)

{
  ostream *poVar1;
  EntityType local_200;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  GED_BasicFixedWingAircraft *local_18;
  GED_BasicFixedWingAircraft *this_local;
  
  local_18 = this;
  this_local = (GED_BasicFixedWingAircraft *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"GED Basic Fixed Wing Aircraft\n");
  poVar1 = std::operator<<(poVar1,"\tEntity ID:                  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16EntityID);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tLocation Offsets(x,y,z):    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Offsets[0]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Offsets[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Offsets[2]);
  poVar1 = std::operator<<(poVar1,"\n");
  EntityType::EntityType(&local_200,'\x01','\x02',0,'\0','\0','\0','\0');
  DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_(&local_1f0,&this->m_EA,&local_200);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\tOrientation(Psi,Theta,Phi): ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8Ori[0]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8Ori[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8Ori[2]);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tFuel Status:                ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8FuelStatus);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tHorizontal Deviation:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8HoriDevi);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tVertical Deviation:         ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8VertDevi);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tSpeed:                      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Spd);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  EntityType::~EntityType(&local_200);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GED_BasicFixedWingAircraft::GetAsString() const
{
    KStringStream ss;

    ss << "GED Basic Fixed Wing Aircraft\n"
       << "\tEntity ID:                  " << m_ui16EntityID  << "\n"
       << "\tLocation Offsets(x,y,z):    " << m_i16Offsets[0] << " " << m_i16Offsets[1] << " " << m_i16Offsets[2] << "\n"
       << IndentString( m_EA.GetAsString( EntityType( Platform, Air, 0, 0, 0, 0, 0 ) ), 1 )
       << "\tOrientation(Psi,Theta,Phi): " << ( KINT16 )m_i8Ori[0]    << " " << ( KINT16 )m_i8Ori[1] << " " << ( KINT16 )m_i8Ori[2] << "\n"
       << "\tFuel Status:                " << ( KUINT16 )m_ui8FuelStatus << "\n"
       << "\tHorizontal Deviation:       " << ( KINT16 )m_i8HoriDevi  << "\n"
       << "\tVertical Deviation:         " << ( KINT16 )m_i8VertDevi  << "\n"
       << "\tSpeed:                      " << m_i16Spd << "\n";

    return ss.str();
}